

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManFlowFindBestCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,int Num)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *vCone;
  void **ppvVar5;
  Vec_Ptr_t *vSet;
  Aig_Man_t *vUpper_00;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  
  uVar1 = (long)(p->nObjs[6] + p->nObjs[5]) / (long)Num;
  iVar7 = (int)(((uint)(uVar1 >> 0x1f) & 1) + (int)uVar1) >> 1;
  iVar2 = Llb_ManCutVolume(p,vLower,vUpper);
  iVar3 = iVar2 - iVar7;
  if (iVar3 == 0 || iVar2 < iVar7) {
    __assert_fail("Vol > nVolMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                  ,0x48c,
                  "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)");
  }
  if (iVar7 < iVar3) {
    iVar3 = iVar7;
  }
  vCone = (Vec_Ptr_t *)malloc(0x10);
  vCone->nCap = 100;
  vCone->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vCone->pArray = ppvVar5;
  vSet = (Vec_Ptr_t *)malloc(0x10);
  vSet->nCap = 100;
  vSet->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vSet->pArray = ppvVar5;
  pAVar8 = p;
  Llb_ManFlowPrepareCut(p,vLower,vUpper);
  if (p->nRegs < 2) {
    local_4c = -1;
    local_58 = 1;
  }
  else {
    local_58 = 1;
    local_4c = -1;
    local_54 = 1000000000;
    local_50 = 0;
    do {
      if (0 < vLower->nSize) {
        iVar2 = 0;
        do {
          Llb_ManFlowGetObjSet(pAVar8,vLower,iVar2,local_58,vSet);
          pAVar8 = p;
          Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
          if (vCone->nSize != 0) {
            pAVar8 = p;
            vUpper_00 = (Aig_Man_t *)Llb_ManFlowCompute(p);
            Llb_ManFlowUnmarkCone(pAVar8,vCone);
            iVar4 = Llb_ManCutVolume(p,vLower,(Vec_Ptr_t *)vUpper_00);
            iVar7 = Llb_ManCutVolume(p,(Vec_Ptr_t *)vUpper_00,vUpper);
            if (iVar4 < iVar7) {
              iVar7 = iVar4;
            }
            if ((iVar3 <= iVar7) &&
               (((local_54 == -1 ||
                 (iVar4 = *(int *)((long)&vUpper_00->pName + 4), iVar4 < local_54)) ||
                ((local_54 == iVar4 && (local_50 < iVar7)))))) {
              local_54 = *(int *)((long)&vUpper_00->pName + 4);
              local_50 = iVar7;
              local_4c = iVar2;
            }
            pAVar8 = (Aig_Man_t *)vUpper_00->pSpec;
            if (pAVar8 != (Aig_Man_t *)0x0) {
              free(pAVar8);
              vUpper_00->pSpec = (char *)0x0;
            }
            if (vUpper_00 != (Aig_Man_t *)0x0) {
              free(vUpper_00);
              pAVar8 = vUpper_00;
            }
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < vLower->nSize);
      }
    } while ((local_4c < 0) && (local_58 = local_58 + 5, local_58 < p->nRegs));
  }
  if (local_4c == -1) {
    if (vCone->pArray != (void **)0x0) {
      free(vCone->pArray);
      vCone->pArray = (void **)0x0;
    }
    free(vCone);
    ppvVar5 = vSet->pArray;
    pVVar6 = (Vec_Ptr_t *)0x0;
  }
  else {
    if (local_4c < 0) {
      __assert_fail("iBest >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                    ,0x4b4,
                    "Vec_Ptr_t *Llb_ManFlowFindBestCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)")
      ;
    }
    Llb_ManFlowGetObjSet(pAVar8,vLower,local_4c,local_58,vSet);
    Llb_ManFlowCollectAndMarkCone(p,vSet,vCone);
    pVVar6 = Llb_ManFlowCompute(p);
    Llb_ManFlowUnmarkCone(p,vCone);
    if (vCone->pArray != (void **)0x0) {
      free(vCone->pArray);
      vCone->pArray = (void **)0x0;
    }
    free(vCone);
    ppvVar5 = vSet->pArray;
  }
  if (ppvVar5 != (void **)0x0) {
    free(ppvVar5);
    vSet->pArray = (void **)0x0;
  }
  free(vSet);
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowFindBestCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, int Num )
{
    int nVolMin = Aig_ManNodeNum(p) / Num / 2;
    Vec_Ptr_t * vMinCut;
    Vec_Ptr_t * vCone, * vSet;
    Aig_Obj_t * pObj;
    int i, s, Vol, VolLower, VolUpper, VolCmp;
    int iBest = -1, iMinCut = ABC_INFINITY, iVolBest = 0;

    Vol = Llb_ManCutVolume( p, vLower, vUpper );
    assert( Vol > nVolMin );
    VolCmp = Abc_MinInt( nVolMin, Vol - nVolMin );
    vCone = Vec_PtrAlloc( 100 );
    vSet  = Vec_PtrAlloc( 100 );
    Llb_ManFlowPrepareCut( p, vLower, vUpper );
    for ( s = 1; s < Aig_ManRegNum(p); s += 5 )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        {
            Llb_ManFlowGetObjSet( p, vLower, i, s, vSet );
            Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
            if ( Vec_PtrSize(vCone) == 0 )
                continue;
            vMinCut  = Llb_ManFlowCompute( p );
            Llb_ManFlowUnmarkCone( p, vCone );

            VolLower = Llb_ManCutVolume( p, vLower, vMinCut );
            VolUpper = Llb_ManCutVolume( p, vMinCut, vUpper );
            Vol = Abc_MinInt( VolLower, VolUpper );
            if ( Vol >= VolCmp &&  (iMinCut == -1 || 
                                    iMinCut >  Vec_PtrSize(vMinCut) || 
                                   (iMinCut == Vec_PtrSize(vMinCut) && iVolBest < Vol)) )
            {
                iBest = i;
                iMinCut = Vec_PtrSize(vMinCut);
                iVolBest = Vol;
            }
            Vec_PtrFree( vMinCut );
        }
        if ( iBest >= 0 )
            break;
    }
    if ( iBest == -1 )
    {
        // cleanup
        Vec_PtrFree( vCone );
        Vec_PtrFree( vSet );
        return NULL;
    }
    // get the best cut
    assert( iBest >= 0 );
    Llb_ManFlowGetObjSet( p, vLower, iBest, s, vSet );
    Llb_ManFlowCollectAndMarkCone( p, vSet, vCone );
    vMinCut = Llb_ManFlowCompute( p );
    Llb_ManFlowUnmarkCone( p, vCone );
    // cleanup
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSet );
    return vMinCut;
}